

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

bool __thiscall
iutest::detail::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *testsuite_name,char *test_name)

{
  iu_stringstream *piVar1;
  ostream *poVar2;
  int line_00;
  string local_1e0;
  IUTestLog local_1c0;
  char *local_30;
  char *test_name_local;
  char *testsuite_name_local;
  detail *pdStack_18;
  int line_local;
  char *file_local;
  TypedTestSuitePState *this_local;
  
  local_30 = test_name;
  test_name_local = testsuite_name;
  testsuite_name_local._4_4_ = line;
  pdStack_18 = (detail *)file;
  file_local = (char *)this;
  if (this->m_names != (char *)0x0) {
    line_00 = 0x1aa;
    IUTestLog::IUTestLog
              (&local_1c0,LOG_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
               ,0x1aa);
    piVar1 = IUTestLog::GetStream_abi_cxx11_(&local_1c0);
    FormatCompilerIndependentFileLocation_abi_cxx11_
              (&local_1e0,pdStack_18,(char *)(ulong)testsuite_name_local._4_4_,line_00);
    poVar2 = std::operator<<((ostream *)&piVar1->field_0x10,(string *)&local_1e0);
    poVar2 = std::operator<<(poVar2,": Test \"");
    poVar2 = std::operator<<(poVar2,local_30);
    poVar2 = std::operator<<(poVar2,"\" must be defined before IUTEST_REGISTER_TYPED_TEST_SUITE_P(")
    ;
    poVar2 = std::operator<<(poVar2,test_name_local);
    std::operator<<(poVar2,", ...).\n");
    std::__cxx11::string::~string((string *)&local_1e0);
    IUTestLog::~IUTestLog(&local_1c0);
  }
  std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::insert
            (&this->m_list,&local_30);
  return true;
}

Assistant:

bool AddTestName(const char* file, int line, const char* testsuite_name, const char* test_name)
    {
        if( m_names != NULL )
        {
            IUTEST_LOG_(WARNING) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" must be defined before IUTEST_REGISTER_TYPED_TEST_SUITE_P("
                << testsuite_name << ", ...).\n";
        }
#if IUTEST_TYPED_TEST_P_STRICT
        m_list.insert(test_name);
#endif
        return true;
    }